

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_kv.c
# Opt level: O0

int test_kvtree_kv(void)

{
  int iVar1;
  long lVar2;
  char *__s1;
  long lVar3;
  kvtree *get;
  int size;
  char *valstr;
  kvtree *val;
  kvtree *kvt;
  char *value;
  char *key;
  int rc;
  
  key._4_4_ = 0;
  value = "key";
  kvt = (kvtree *)anon_var_dwarf_233;
  val = (kvtree *)kvtree_new();
  if (val == (kvtree *)0x0) {
    key._4_4_ = 1;
  }
  lVar2 = kvtree_set_kv(val,value,kvt);
  if (lVar2 == 0) {
    key._4_4_ = 1;
  }
  __s1 = (char *)kvtree_elem_get_first_val(val,value);
  iVar1 = strcmp(__s1,(char *)kvt);
  if (iVar1 != 0) {
    key._4_4_ = 1;
  }
  iVar1 = kvtree_size(val);
  if (iVar1 != 1) {
    key._4_4_ = 1;
  }
  lVar3 = kvtree_get_kv(val,value,kvt);
  if (lVar3 != lVar2) {
    key._4_4_ = 1;
  }
  iVar1 = kvtree_unset_kv(val,value,kvt);
  if (iVar1 != 0) {
    key._4_4_ = 1;
  }
  iVar1 = kvtree_size(val);
  if (iVar1 != 0) {
    key._4_4_ = 1;
  }
  kvtree_delete(&val);
  return key._4_4_;
}

Assistant:

int test_kvtree_kv(){
  int rc = TEST_PASS;
  char* key = "key";
  char* value = "value";

  kvtree* kvt = kvtree_new();
  if (kvt == NULL) rc = TEST_FAIL;

  kvtree* val = kvtree_set_kv(kvt, key, value);
  if (val == NULL) rc = TEST_FAIL;
  char* valstr = kvtree_elem_get_first_val(kvt, key);
  if(strcmp(valstr, value)) rc = TEST_FAIL;

  int size = kvtree_size(kvt);
  if (size != 1) rc = TEST_FAIL;

  kvtree* get = kvtree_get_kv(kvt, key, value);
  if (get != val) rc = TEST_FAIL;

  if(kvtree_unset_kv(kvt, key, value) != KVTREE_SUCCESS) rc = TEST_FAIL;
  size = kvtree_size(kvt);
  if(size != 0) rc = TEST_FAIL;

  kvtree_delete(&kvt);
  return rc;
}